

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O0

string * __thiscall
PolicyPoolPartialJPolValPair::SoftPrint_abi_cxx11_(PolicyPoolPartialJPolValPair *this)

{
  void *pvVar1;
  size_type sVar2;
  type pPVar3;
  string *in_RDI;
  PartialJPDPValuePair_sharedPtr jpvp;
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *new_jpvpQueue_p;
  stringstream ss;
  shared_ptr<PartialJPDPValuePair> *in_stack_fffffffffffffdc8;
  shared_ptr<PartialJPDPValuePair> *in_stack_fffffffffffffdd0;
  ostream *this_00;
  string local_1e0 [32];
  shared_ptr<PartialJPDPValuePair> local_1c0 [2];
  void *local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  pvVar1 = operator_new(0x20);
  std::
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::priority_queue((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                    *)in_stack_fffffffffffffdd0,
                   (priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                    *)in_stack_fffffffffffffdc8);
  local_1a0 = pvVar1;
  while( true ) {
    sVar2 = std::
            priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
            ::size((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                    *)0x978e9e);
    if (sVar2 == 0) break;
    std::
    priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::top((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
           *)0x978ec1);
    boost::shared_ptr<PartialJPDPValuePair>::shared_ptr
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    this_00 = local_188;
    pPVar3 = boost::shared_ptr<PartialJPDPValuePair>::operator->(local_1c0);
    (*(pPVar3->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[0xf])(local_1e0);
    in_stack_fffffffffffffdd0 =
         (shared_ptr<PartialJPDPValuePair> *)std::operator<<(this_00,local_1e0);
    std::ostream::operator<<(in_stack_fffffffffffffdd0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    std::
    priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::pop((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
           *)this_00);
    boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
              ((shared_ptr<PartialJPDPValuePair> *)0x978f5b);
  }
  if (local_1a0 != (void *)0x0) {
    pvVar1 = local_1a0;
    std::
    priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::~priority_queue((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                       *)0x978ffc);
    operator_delete(pvVar1,0x20);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string PolicyPoolPartialJPolValPair::SoftPrint() const
{
    stringstream ss;
    priority_queue<PartialJPDPValuePair_sharedPtr> *new_jpvpQueue_p = 
        new priority_queue<PartialJPDPValuePair_sharedPtr>(*_m_jpvpQueue_p);

    while(new_jpvpQueue_p->size() > 0)
    {
        PartialJPDPValuePair_sharedPtr jpvp = new_jpvpQueue_p->top();
        ss << jpvp->SoftPrint() << endl;

        new_jpvpQueue_p->pop();    
    }

    delete new_jpvpQueue_p;
    return(ss.str());
}